

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

void __thiscall cmComputeLinkInformation::LoadImplicitLinkInfo(cmComputeLinkInformation *this)

{
  cmMakefile *pcVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init_00;
  bool bVar2;
  string *psVar3;
  _Base_ptr a;
  cmValue value;
  iterator __first;
  iterator __last;
  value_type *__x;
  value_type *__x_00;
  undefined1 auVar4 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_270;
  allocator<char> local_239;
  string local_238;
  string *local_218;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  *local_210;
  reference local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *item;
  iterator __end1;
  iterator __begin1;
  cmList *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  iterator local_1b0;
  size_type local_1a8;
  undefined1 local_1a0 [8];
  cmList implicitLibs;
  string implicitLibVar;
  undefined1 local_148 [8];
  string implicitDirVar;
  char local_111;
  _Base_ptr local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *i;
  iterator __end2;
  iterator __begin2;
  cmList *__range2;
  string local_c8;
  cmValue local_a8;
  cmValue libraryArch;
  allocator<char> local_89;
  string local_88;
  cmValue local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  cmList implicitDirs;
  cmComputeLinkInformation *this_local;
  
  libraryArch.Value._3_1_ = 1;
  local_60 = &local_58;
  pcVar1 = this->Makefile;
  implicitDirs.Values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"CMAKE_PLATFORM_IMPLICIT_LINK_DIRECTORIES",&local_89);
  local_68 = cmMakefile::GetDefinition(pcVar1,&local_88);
  psVar3 = cmValue::operator_cast_to_string_(&local_68);
  std::__cxx11::string::string((string *)&local_58,(string *)psVar3);
  libraryArch.Value._3_1_ = 0;
  local_38 = &local_58;
  local_30 = 1;
  init_00._M_len = 1;
  init_00._M_array = local_38;
  cmList::cmList((cmList *)local_28,init_00);
  local_270 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_38;
  do {
    local_270 = local_270 + -1;
    std::__cxx11::string::~string((string *)local_270);
  } while (local_270 != &local_58);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"CMAKE_LIBRARY_ARCHITECTURE",
             (allocator<char> *)((long)&__range2 + 7));
  local_a8 = cmMakefile::GetDefinition(pcVar1,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
  bVar2 = cmValue::operator_cast_to_bool(&local_a8);
  if (bVar2) {
    __end2 = cmList::begin_abi_cxx11_((cmList *)local_28);
    i = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        cmList::end_abi_cxx11_((cmList *)local_28);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&i), bVar2) {
      a = (_Base_ptr)
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator*(&__end2);
      local_111 = '/';
      local_f0 = a;
      psVar3 = cmValue::operator*[abi_cxx11_(&local_a8);
      cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string_const&>
                ((string *)&stack0xfffffffffffffef0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)a,&local_111,
                 psVar3);
      implicitDirVar.field_2._8_8_ =
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::insert((pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
                     *)&this->ImplicitLinkDirs,
                    (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&stack0xfffffffffffffef0,__x);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffef0);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
  }
  cmStrCat<char_const(&)[7],std::__cxx11::string&,char_const(&)[27]>
            ((string *)local_148,(char (*) [7])0xff3e8d,&this->LinkLanguage,(char (*) [27])0x102c314
            );
  value = cmMakefile::GetDefinition(this->Makefile,(string *)local_148);
  cmList::append_abi_cxx11_((cmList *)local_28,value,Yes,No);
  __first = cmList::begin_abi_cxx11_((cmList *)local_28);
  __last = cmList::end_abi_cxx11_((cmList *)local_28);
  std::
  set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::
  insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&this->ImplicitLinkDirs,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )__first._M_current,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )__last._M_current);
  cmStrCat<char_const(&)[7],std::__cxx11::string&,char_const(&)[25]>
            ((string *)
             &implicitLibs.Values.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(char (*) [7])0xff3e8d,
             &this->LinkLanguage,(char (*) [25])"_IMPLICIT_LINK_LIBRARIES");
  local_1d8 = &local_1d0;
  __range1 = (cmList *)
             cmMakefile::GetDefinition
                       (this->Makefile,
                        (string *)
                        &implicitLibs.Values.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  psVar3 = cmValue::operator_cast_to_string_((cmValue *)&__range1);
  std::__cxx11::string::string((string *)&local_1d0,(string *)psVar3);
  local_1b0 = &local_1d0;
  local_1a8 = 1;
  init._M_len = 1;
  init._M_array = local_1b0;
  cmList::cmList((cmList *)local_1a0,init);
  local_310 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1b0;
  do {
    local_310 = local_310 + -1;
    std::__cxx11::string::~string((string *)local_310);
  } while (local_310 != &local_1d0);
  __end1 = cmList::begin_abi_cxx11_((cmList *)local_1a0);
  item = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         cmList::end_abi_cxx11_((cmList *)local_1a0);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&item);
    if (!bVar2) {
      pcVar1 = this->Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_238,"CMAKE_PLATFORM_RUNTIME_PATH",&local_239);
      local_218 = (string *)cmMakefile::GetDefinition(pcVar1,&local_238);
      cmList::append(&this->RuntimeLinkDirs,(cmValue)local_218,No);
      std::__cxx11::string::~string((string *)&local_238);
      std::allocator<char>::~allocator(&local_239);
      cmList::~cmList((cmList *)local_1a0);
      std::__cxx11::string::~string
                ((string *)
                 &implicitLibs.Values.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string((string *)local_148);
      cmList::~cmList((cmList *)local_28);
      return;
    }
    local_200 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end1);
    auVar4 = std::__cxx11::string::operator[]((ulong)local_200);
    __x_00 = auVar4._8_8_;
    if (*auVar4._0_8_ == '-') {
      auVar4 = std::__cxx11::string::operator[]((ulong)local_200);
      __x_00 = auVar4._8_8_;
      if (*auVar4._0_8_ == 'l') goto LAB_0071aa9a;
    }
    else {
LAB_0071aa9a:
      local_210 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
                            *)&this->ImplicitLinkLibs,
                           (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_200,__x_00);
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void cmComputeLinkInformation::LoadImplicitLinkInfo()
{
  // Get platform-wide implicit directories.
  cmList implicitDirs{ this->Makefile->GetDefinition(
    "CMAKE_PLATFORM_IMPLICIT_LINK_DIRECTORIES") };

  // Append library architecture to all implicit platform directories
  // and add them to the set
  if (cmValue libraryArch =
        this->Makefile->GetDefinition("CMAKE_LIBRARY_ARCHITECTURE")) {
    for (auto const& i : implicitDirs) {
      this->ImplicitLinkDirs.insert(cmStrCat(i, '/', *libraryArch));
    }
  }

  // Get language-specific implicit directories.
  std::string implicitDirVar =
    cmStrCat("CMAKE_", this->LinkLanguage, "_IMPLICIT_LINK_DIRECTORIES");
  implicitDirs.append(this->Makefile->GetDefinition(implicitDirVar));

  // Store implicit link directories.
  this->ImplicitLinkDirs.insert(implicitDirs.begin(), implicitDirs.end());

  // Get language-specific implicit libraries.
  std::string implicitLibVar =
    cmStrCat("CMAKE_", this->LinkLanguage, "_IMPLICIT_LINK_LIBRARIES");
  cmList implicitLibs{ this->Makefile->GetDefinition(implicitLibVar) };

  // Store implicit link libraries.
  for (auto const& item : implicitLibs) {
    // Items starting in '-' but not '-l' are flags, not libraries,
    // and should not be filtered by this implicit list.
    if (item[0] != '-' || item[1] == 'l') {
      this->ImplicitLinkLibs.insert(item);
    }
  }

  // Get platform specific rpath link directories
  cmList::append(this->RuntimeLinkDirs,
                 this->Makefile->GetDefinition("CMAKE_PLATFORM_RUNTIME_PATH"));
}